

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_buf.c
# Opt level: O1

zt_buf_t * zt_buf_new(void)

{
  zt_buf_t *pzVar1;
  
  pzVar1 = (zt_buf_t *)zt_malloc_p(0x20);
  if (pzVar1 != (zt_buf_t *)0x0) {
    pzVar1->buf = (void *)0x0;
    pzVar1->top = (void *)0x0;
    pzVar1->len = 0;
    pzVar1->max = 0;
    return pzVar1;
  }
  return (zt_buf_t *)0x0;
}

Assistant:

zt_buf_t *
zt_buf_new(void) {
    zt_buf_t * b;

    if (!(b = zt_malloc(zt_buf_t, 1))) {
        return NULL;
    }

    b->len = 0;
    b->max = 0;
    b->buf = NULL;
    b->top = NULL;

    return b;
}